

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O0

void thread_local_destructor(void *arg)

{
  thread_local_destructor_t __ptr;
  int iVar1;
  void **pointers;
  uint i;
  thread_local_destructor_t destructors [5];
  void *arg_local;
  
  if ((arg != (void *)0x0) &&
     (destructors[4] = (thread_local_destructor_t)arg,
     iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_destructors_lock), iVar1 == 0)) {
    OPENSSL_memcpy(&stack0xffffffffffffffc8,g_destructors,0x28);
    pthread_mutex_unlock((pthread_mutex_t *)&g_destructors_lock);
    __ptr = destructors[4];
    for (pointers._4_4_ = 0; pointers._4_4_ < 5; pointers._4_4_ = pointers._4_4_ + 1) {
      if (destructors[(ulong)pointers._4_4_ - 1] != (thread_local_destructor_t)0x0) {
        (*destructors[(ulong)pointers._4_4_ - 1])(*(void **)(__ptr + (ulong)pointers._4_4_ * 8));
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void thread_local_destructor(void *arg) {
  if (arg == NULL) {
    return;
  }

  thread_local_destructor_t destructors[NUM_OPENSSL_THREAD_LOCALS];
  if (pthread_mutex_lock(&g_destructors_lock) != 0) {
    return;
  }
  OPENSSL_memcpy(destructors, g_destructors, sizeof(destructors));
  pthread_mutex_unlock(&g_destructors_lock);

  unsigned i;
  void **pointers = reinterpret_cast<void **>(arg);
  for (i = 0; i < NUM_OPENSSL_THREAD_LOCALS; i++) {
    if (destructors[i] != NULL) {
      destructors[i](pointers[i]);
    }
  }

  free(pointers);
}